

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ellipsoid.cpp
# Opt level: O1

HydroProp * __thiscall OpenMD::Ellipsoid::getHydroProp(Ellipsoid *this,RealType viscosity)

{
  double dVar1;
  pointer pcVar2;
  double dVar3;
  double __x;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  HydroProp *this_00;
  double *__s;
  uint i;
  long lVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  Mat6x6d Xi;
  double local_2d0;
  long *local_298 [2];
  long local_288 [2];
  Vector3d local_278;
  Mat6x6d local_258;
  double local_138 [14];
  double local_c8;
  double local_90;
  double local_58;
  double local_20;
  
  dVar15 = this->rAxial_;
  dVar1 = this->rEquatorial_;
  dVar13 = dVar15 * dVar15;
  dVar3 = dVar1 * dVar1;
  __x = dVar13 - dVar3;
  if (dVar15 / dVar1 <= 1.0) {
    dVar14 = dVar3 - dVar13;
    dVar1 = SQRT(dVar14);
    local_2d0 = dVar1;
    if (dVar14 < 0.0) {
      local_2d0 = sqrt(dVar14);
      dVar1 = sqrt(dVar14);
    }
    dVar1 = atan(dVar1 / dVar15);
    uVar11 = SUB84(dVar1,0);
    uVar12 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  else {
    dVar14 = SQRT(__x);
    local_2d0 = dVar14;
    if (__x < 0.0) {
      local_2d0 = sqrt(__x);
      dVar14 = sqrt(__x);
    }
    dVar1 = log((dVar14 + dVar15) / dVar1);
    uVar11 = SUB84(dVar1,0);
    uVar12 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  local_2d0 = 2.0 / local_2d0;
  local_2d0 = local_2d0 * (double)CONCAT44(uVar12,uVar11);
  dVar15 = dVar15 + dVar15;
  dVar1 = ((dVar13 + dVar13) - dVar3) * local_2d0 - dVar15;
  dVar14 = (viscosity * 100.53096491487338 * __x) /
           ((dVar3 * -3.0 + dVar13 + dVar13) * local_2d0 + dVar15);
  dVar13 = ((dVar13 * dVar13 - dVar3 * dVar3) * viscosity * 33.510321638291124) / dVar1;
  __s = local_138;
  lVar10 = 0;
  memset(__s,0,0x120);
  local_138[0] = dVar14;
  local_138[7] = dVar14;
  local_c8 = (viscosity * 50.26548245743669 * __x) / dVar1;
  local_90 = dVar13;
  local_58 = dVar13;
  local_20 = (__x * viscosity * 33.510321638291124 * dVar3) / (dVar15 - local_2d0 * dVar3);
  do {
    lVar9 = 0;
    do {
      dVar15 = (__s + lVar9)[1];
      __s[lVar9] = __s[lVar9] * 14393.26479;
      (__s + lVar9)[1] = dVar15 * 14393.26479;
      lVar9 = lVar9 + 2;
    } while (lVar9 != 6);
    lVar10 = lVar10 + 1;
    __s = __s + 6;
  } while (lVar10 != 6);
  this_00 = (HydroProp *)operator_new(0x280);
  local_278.super_Vector<double,_3U>.data_[0] = (double)OpenMD::V3Zero._0_8_;
  local_278.super_Vector<double,_3U>.data_[1] = (double)OpenMD::V3Zero._8_8_;
  local_278.super_Vector<double,_3U>.data_[2] = (double)OpenMD::V3Zero._16_8_;
  lVar10 = 0;
  do {
    uVar4 = *(undefined8 *)((long)local_138 + lVar10);
    uVar5 = *(undefined8 *)((long)local_138 + lVar10 + 8);
    uVar6 = *(undefined8 *)((long)local_138 + lVar10 + 0x10);
    uVar7 = *(undefined8 *)((long)local_138 + lVar10 + 0x18);
    uVar8 = *(undefined8 *)((long)local_138 + lVar10 + 0x28);
    *(undefined8 *)((long)local_258.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 + 0x20) =
         *(undefined8 *)((long)local_138 + lVar10 + 0x20);
    *(undefined8 *)((long)local_258.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 + 0x28) =
         uVar8;
    *(undefined8 *)((long)local_258.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 + 0x10) =
         uVar6;
    *(undefined8 *)((long)local_258.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 + 0x18) =
         uVar7;
    *(undefined8 *)((long)local_258.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10) = uVar4;
    *(undefined8 *)((long)local_258.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar10 + 8) = uVar5;
    lVar10 = lVar10 + 0x30;
  } while (lVar10 != 0x120);
  HydroProp::HydroProp(this_00,&local_278,&local_258);
  pcVar2 = (this->super_Shape).name_._M_dataplus._M_p;
  local_298[0] = local_288;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_298,pcVar2,pcVar2 + (this->super_Shape).name_._M_string_length);
  std::__cxx11::string::_M_assign((string *)this_00);
  if (local_298[0] != local_288) {
    operator_delete(local_298[0],local_288[0] + 1);
  }
  return this_00;
}

Assistant:

HydroProp* Ellipsoid::getHydroProp(RealType viscosity) {
    RealType a  = rAxial_;
    RealType b  = rEquatorial_;
    RealType a2 = a * a;
    RealType b2 = b * b;

    RealType p = a / b;
    RealType S;
    if (p > 1.0) {
      // Ellipsoid is prolate:
      S = 2.0 / sqrt(a2 - b2) * log((a + sqrt(a2 - b2)) / b);
    } else {
      // Ellipsoid is oblate:
      S = 2.0 / sqrt(b2 - a2) * atan(sqrt(b2 - a2) / a);
    }

    RealType pi = Constants::PI;
    RealType XittA =
        16.0 * pi * viscosity * (a2 - b2) / ((2.0 * a2 - b2) * S - 2.0 * a);
    RealType XittB = 32.0 * pi * viscosity * (a2 - b2) /
                     ((2.0 * a2 - 3.0 * b2) * S + 2.0 * a);
    RealType XirrA =
        32.0 / 3.0 * pi * viscosity * (a2 - b2) * b2 / (2.0 * a - b2 * S);
    RealType XirrB = 32.0 / 3.0 * pi * viscosity * (a2 * a2 - b2 * b2) /
                     ((2.0 * a2 - b2) * S - 2.0 * a);

    Mat6x6d Xi;

    Xi(0, 0) = XittB;
    Xi(1, 1) = XittB;
    Xi(2, 2) = XittA;
    Xi(3, 3) = XirrB;
    Xi(4, 4) = XirrB;
    Xi(5, 5) = XirrA;

    Xi *= Constants::viscoConvert;

    HydroProp* hprop = new HydroProp(V3Zero, Xi);
    hprop->setName(getName());

    return hprop;
  }